

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.c
# Opt level: O0

wchar_t hist_init(EditLine *el)

{
  wchar_t *pwVar1;
  EditLine *el_local;
  
  (el->el_history).fun = (hist_fun_t)0x0;
  (el->el_history).ref = (void *)0x0;
  pwVar1 = (wchar_t *)calloc(0x400,4);
  (el->el_history).buf = pwVar1;
  if ((el->el_history).buf == (wchar_t *)0x0) {
    el_local._4_4_ = L'\xffffffff';
  }
  else {
    (el->el_history).sz = 0x400;
    (el->el_history).last = (el->el_history).buf;
    el_local._4_4_ = L'\0';
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
hist_init(EditLine *el)
{

	el->el_history.fun = NULL;
	el->el_history.ref = NULL;
	el->el_history.buf = el_calloc(EL_BUFSIZ, sizeof(*el->el_history.buf));
	if (el->el_history.buf == NULL)
		return -1;
	el->el_history.sz  = EL_BUFSIZ;
	el->el_history.last = el->el_history.buf;
	return 0;
}